

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void __thiscall
ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
          (ArenaVectorBase<ArenaVector<bool>,bool> *this,vector<bool,_std::allocator<bool>_> *list)

{
  ulong size;
  void *pvVar1;
  ulong *puVar2;
  ulong *puVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  puVar2 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar3 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar4 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  size = (ulong)uVar4 + ((long)puVar3 - (long)puVar2) * 8;
  if (*(ulong *)(this + 0x10) < size) {
    *(ulong *)(this + 0x10) = size;
    pvVar1 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),size,1);
    *(void **)this = pvVar1;
    puVar2 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    puVar3 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
    uVar4 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset;
  }
  if (uVar4 != 0 || puVar2 != puVar3) {
    lVar5 = *(long *)this;
    uVar7 = 0;
    do {
      *(bool *)lVar5 = (*puVar2 >> (uVar7 & 0x3f) & 1) != 0;
      iVar6 = (int)uVar7;
      puVar2 = puVar2 + (iVar6 == 0x3f);
      uVar7 = (ulong)(iVar6 + 1);
      if (iVar6 == 0x3f) {
        uVar7 = 0;
      }
      lVar5 = lVar5 + 1;
    } while ((uint)uVar7 != uVar4 || puVar2 != puVar3);
  }
  *(ulong *)(this + 8) = size;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }